

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

uint8 * __thiscall
caffe::BiasParameter::InternalSerializeWithCachedSizesToArray
          (BiasParameter *this,bool deterministic,uint8 *target)

{
  FillerParameter *this_00;
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  uint8 *puVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 2) != 0) {
    uVar7 = (ulong)this->axis_;
    pbVar6 = target + 1;
    *target = '\b';
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar5 & 4) != 0) {
    uVar7 = (ulong)this->num_axes_;
    pbVar6 = target + 1;
    *target = 0x10;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar7;
    target = pbVar6 + 1;
  }
  if ((uVar5 & 1) != 0) {
    this_00 = this->filler_;
    *target = 0x1a;
    pbVar6 = target + 1;
    uVar5 = this_00->_cached_size_;
    uVar3 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar6 = (byte)uVar5 | 0x80;
        uVar3 = uVar5 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar5;
        uVar5 = uVar3;
      } while (bVar2);
    }
    *pbVar6 = (byte)uVar3;
    target = FillerParameter::InternalSerializeWithCachedSizesToArray(this_00,false,pbVar6 + 1);
  }
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* BiasParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.BiasParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 axis = 1 [default = 1];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->axis(), target);
  }

  // optional int32 num_axes = 2 [default = 1];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(2, this->num_axes(), target);
  }

  // optional .caffe.FillerParameter filler = 3;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        3, *this->filler_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.BiasParameter)
  return target;
}